

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

StbUndoRecord * ImGuiStb::stb_text_create_undo_record(StbUndoState *state,int numchars)

{
  short sVar1;
  int in_ESI;
  StbUndoState *in_RDI;
  StbUndoRecord *local_8;
  
  stb_textedit_flush_redo(in_RDI);
  if (in_RDI->undo_point == 99) {
    stb_textedit_discard_undo(in_RDI);
  }
  if (in_ESI < 1000) {
    while (999 < in_RDI->undo_char_point + in_ESI) {
      stb_textedit_discard_undo(in_RDI);
    }
    sVar1 = in_RDI->undo_point;
    in_RDI->undo_point = sVar1 + 1;
    local_8 = in_RDI->undo_rec + sVar1;
  }
  else {
    in_RDI->undo_point = 0;
    in_RDI->undo_char_point = 0;
    local_8 = (StbUndoRecord *)0x0;
  }
  return local_8;
}

Assistant:

static StbUndoRecord *stb_text_create_undo_record(StbUndoState *state, int numchars)
{
   // any time we create a new undo record, we discard redo
   stb_textedit_flush_redo(state);

   // if we have no free records, we have to make room, by sliding the
   // existing records down
   if (state->undo_point == STB_TEXTEDIT_UNDOSTATECOUNT)
      stb_textedit_discard_undo(state);

   // if the characters to store won't possibly fit in the buffer, we can't undo
   if (numchars > STB_TEXTEDIT_UNDOCHARCOUNT) {
      state->undo_point = 0;
      state->undo_char_point = 0;
      return NULL;
   }

   // if we don't have enough free characters in the buffer, we have to make room
   while (state->undo_char_point + numchars > STB_TEXTEDIT_UNDOCHARCOUNT)
      stb_textedit_discard_undo(state);

   return &state->undo_rec[state->undo_point++];
}